

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.hpp
# Opt level: O0

bool __thiscall relive::Stream::needsUpdate(Stream *this,Stream *ns)

{
  bool bVar1;
  long in_RSI;
  long in_RDI;
  undefined1 local_11;
  
  local_11 = true;
  if ((*(long *)(in_RDI + 8) == *(long *)(in_RSI + 8)) &&
     (local_11 = true, *(long *)(in_RDI + 0x10) == *(long *)(in_RSI + 0x10))) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (in_RDI + 0x18),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (in_RSI + 0x18));
    local_11 = true;
    if (!bVar1) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (in_RDI + 0x38),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (in_RSI + 0x38));
      local_11 = true;
      if (!bVar1) {
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(in_RDI + 0x58),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(in_RSI + 0x58));
        local_11 = true;
        if ((((!bVar1) && (local_11 = true, *(long *)(in_RDI + 0x78) == *(long *)(in_RSI + 0x78)))
            && (local_11 = true, *(long *)(in_RDI + 0x80) == *(long *)(in_RSI + 0x80))) &&
           (local_11 = true, *(long *)(in_RDI + 0x88) == *(long *)(in_RSI + 0x88))) {
          bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(in_RDI + 0x90),
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(in_RSI + 0x90));
          local_11 = true;
          if ((((!bVar1) && (local_11 = true, *(long *)(in_RDI + 0xb0) == *(long *)(in_RSI + 0xb0)))
              && ((local_11 = true, *(long *)(in_RDI + 0xb8) == *(long *)(in_RSI + 0xb8) &&
                  ((local_11 = true, *(long *)(in_RDI + 0xc0) == *(long *)(in_RSI + 0xc0) &&
                   (local_11 = true, *(long *)(in_RDI + 200) == *(long *)(in_RSI + 200))))))) &&
             (local_11 = true, *(int *)(in_RDI + 0xd8) == *(int *)(in_RSI + 0xd8))) {
            local_11 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(in_RDI + 0xe0),
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)(in_RSI + 0xe0));
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool needsUpdate(const Stream& ns)
    {
        return (_reliveId != ns._reliveId || _stationId != ns._stationId || _name != ns._name ||
                _host != ns._host || _description != ns._description || _timestamp != ns._timestamp ||
                _duration != ns._duration || _size != ns._size || _format != ns._format || _mediaOffset != ns._mediaOffset ||
                _streamInfoChecksum != ns._streamInfoChecksum || _chatChecksum != ns._chatChecksum || _mediaChecksum != ns._mediaChecksum ||
                _flags != ns._flags || _metaInfo != ns._metaInfo);
    }